

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O3

ELzmaDummy LzmaDec_TryDummy(CLzmaDec *p,Byte *buf,SizeT inSize)

{
  uint symbol;
  ELzmaDummy EVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  byte *pbVar11;
  ELzmaDummy EVar12;
  SizeT SVar13;
  byte *pbVar14;
  UInt16 *pUVar15;
  uint i;
  UInt32 UVar16;
  uint uVar17;
  uint uVar18;
  
  uVar10 = p->range;
  UVar16 = p->code;
  pUVar15 = p->probs;
  uVar6 = p->state;
  uVar7 = p->processedPos;
  uVar17 = ~(-1 << ((byte)(p->prop).pb & 0x1f)) & uVar7;
  pbVar14 = buf;
  if (uVar10 < 0x1000000) {
    if ((long)inSize < 1) {
      return DUMMY_ERROR;
    }
    uVar10 = uVar10 << 8;
    UVar16 = UVar16 << 8 | (uint)*buf;
    pbVar14 = buf + 1;
  }
  pbVar11 = buf + inSize;
  uVar5 = (uVar10 >> 0xb) * (uint)pUVar15[(ulong)(uVar6 << 4) + (ulong)uVar17];
  uVar3 = UVar16 - uVar5;
  if (UVar16 < uVar5) {
    pUVar15 = pUVar15 + 0x736;
    if (p->checkDicSize != 0 || uVar7 != 0) {
      bVar2 = (byte)(p->prop).lc;
      SVar13 = p->dicPos;
      if (SVar13 == 0) {
        SVar13 = p->dicBufSize;
      }
      pUVar15 = pUVar15 + ((uint)(p->dic[SVar13 - 1] >> (8 - bVar2 & 0x1f)) +
                          ((uVar7 & ~(-1 << ((byte)(p->prop).lp & 0x1f))) << (bVar2 & 0x1f))) *
                          0x300;
    }
    if (uVar6 < 7) {
      uVar10 = 1;
      do {
        if (uVar5 < 0x1000000) {
          if (pbVar11 <= pbVar14) {
            return DUMMY_ERROR;
          }
          uVar5 = uVar5 << 8;
          bVar2 = *pbVar14;
          pbVar14 = pbVar14 + 1;
          UVar16 = UVar16 << 8 | (uint)bVar2;
        }
        uVar6 = (uVar5 >> 0xb) * (uint)pUVar15[uVar10];
        if (UVar16 < uVar6) {
          uVar10 = uVar10 * 2;
          uVar5 = uVar6;
        }
        else {
          uVar5 = uVar5 - uVar6;
          uVar10 = uVar10 * 2 + 1;
          UVar16 = UVar16 - uVar6;
        }
      } while (uVar10 < 0x100);
    }
    else {
      if (p->dicPos < (ulong)p->reps[0]) {
        SVar13 = p->dicBufSize;
      }
      else {
        SVar13 = 0;
      }
      uVar6 = (uint)p->dic[SVar13 + (p->dicPos - (ulong)p->reps[0])];
      uVar10 = 1;
      uVar7 = 0x100;
      do {
        uVar6 = uVar6 * 2;
        uVar3 = uVar6 & uVar7;
        uVar17 = uVar5;
        if (uVar5 < 0x1000000) {
          if (pbVar11 <= pbVar14) {
            return DUMMY_ERROR;
          }
          uVar17 = uVar5 << 8;
          bVar2 = *pbVar14;
          pbVar14 = pbVar14 + 1;
          UVar16 = UVar16 << 8 | (uint)bVar2;
        }
        uVar5 = (uVar17 >> 0xb) * (uint)pUVar15[(ulong)uVar7 + (ulong)uVar3 + (ulong)uVar10];
        uVar8 = UVar16 - uVar5;
        if (UVar16 < uVar5) {
          uVar10 = uVar10 * 2;
          uVar7 = uVar3 ^ uVar7;
        }
        else {
          uVar5 = uVar17 - uVar5;
          uVar10 = uVar10 * 2 + 1;
          UVar16 = uVar8;
          uVar7 = uVar3;
        }
      } while (uVar10 < 0x100);
    }
    EVar12 = DUMMY_LIT;
  }
  else {
    uVar10 = uVar10 - uVar5;
    if (uVar10 < 0x1000000) {
      if (pbVar11 <= pbVar14) {
        return DUMMY_ERROR;
      }
      uVar10 = uVar10 * 0x100;
      bVar2 = *pbVar14;
      pbVar14 = pbVar14 + 1;
      uVar3 = uVar3 * 0x100 | (uint)bVar2;
    }
    uVar8 = (uVar10 >> 0xb) * (uint)pUVar15[(ulong)uVar6 + 0xc0];
    uVar7 = uVar3 - uVar8;
    if (uVar3 < uVar8) {
      EVar12 = DUMMY_MATCH;
      lVar9 = 0x664;
      uVar7 = uVar3;
      uVar18 = uVar8;
    }
    else {
      uVar10 = uVar10 - uVar8;
      if (uVar10 < 0x1000000) {
        if (pbVar11 <= pbVar14) {
          return DUMMY_ERROR;
        }
        uVar10 = uVar10 * 0x100;
        bVar2 = *pbVar14;
        pbVar14 = pbVar14 + 1;
        uVar7 = uVar7 * 0x100 | (uint)bVar2;
      }
      uVar18 = (uVar10 >> 0xb) * (uint)pUVar15[(ulong)uVar6 + 0xcc];
      uVar5 = uVar7 - uVar18;
      if (uVar7 < uVar18) {
        if (uVar18 < 0x1000000) {
          if (pbVar11 <= pbVar14) {
            return DUMMY_ERROR;
          }
          uVar18 = uVar18 * 0x100;
          bVar2 = *pbVar14;
          pbVar14 = pbVar14 + 1;
          uVar7 = uVar7 << 8 | (uint)bVar2;
        }
        uVar10 = (uVar18 >> 0xb) * (uint)pUVar15[(ulong)(uVar6 << 4) + (ulong)uVar17 + 0xf0];
        if (uVar7 < uVar10) {
          if (uVar10 < 0x1000000) {
            return (uint)(pbVar14 < pbVar11) * 3;
          }
          return DUMMY_REP;
        }
        uVar18 = uVar18 - uVar10;
        EVar12 = DUMMY_REP;
        lVar9 = 0xa68;
        uVar7 = uVar7 - uVar10;
      }
      else {
        uVar10 = uVar10 - uVar18;
        if (uVar10 < 0x1000000) {
          if (pbVar11 <= pbVar14) {
            return DUMMY_ERROR;
          }
          uVar10 = uVar10 * 0x100;
          bVar2 = *pbVar14;
          pbVar14 = pbVar14 + 1;
          uVar5 = uVar5 * 0x100 | (uint)bVar2;
        }
        uVar18 = (uVar10 >> 0xb) * (uint)pUVar15[(ulong)uVar6 + 0xd8];
        EVar12 = DUMMY_REP;
        lVar9 = 0xa68;
        uVar7 = uVar5;
        if (uVar18 <= uVar5) {
          uVar10 = uVar10 - uVar18;
          uVar7 = uVar5 - uVar18;
          if (uVar10 < 0x1000000) {
            if (pbVar11 <= pbVar14) {
              return DUMMY_ERROR;
            }
            uVar10 = uVar10 * 0x100;
            bVar2 = *pbVar14;
            pbVar14 = pbVar14 + 1;
            uVar7 = (uVar5 - uVar18) * 0x100 | (uint)bVar2;
          }
          uVar18 = (uVar10 >> 0xb) * (uint)pUVar15[(ulong)uVar6 + 0xe4];
          uVar6 = uVar7 - uVar18;
          if (uVar18 <= uVar7) {
            uVar18 = uVar10 - uVar18;
            uVar7 = uVar6;
          }
        }
      }
    }
    if (uVar18 < 0x1000000) {
      if (pbVar11 <= pbVar14) {
        return DUMMY_ERROR;
      }
      uVar18 = uVar18 << 8;
      bVar2 = *pbVar14;
      pbVar14 = pbVar14 + 1;
      uVar7 = uVar7 << 8 | (uint)bVar2;
    }
    uVar5 = (uVar18 >> 0xb) * (uint)*(ushort *)((long)pUVar15 + lVar9);
    uVar10 = uVar7 - uVar5;
    if (uVar7 < uVar5) {
      lVar9 = (long)pUVar15 + (ulong)(uVar17 << 3) * 2 + lVar9 + 4;
      iVar4 = 0;
      uVar6 = 8;
    }
    else {
      uVar18 = uVar18 - uVar5;
      if (uVar18 < 0x1000000) {
        if (pbVar11 <= pbVar14) {
          return DUMMY_ERROR;
        }
        uVar18 = uVar18 * 0x100;
        bVar2 = *pbVar14;
        pbVar14 = pbVar14 + 1;
        uVar10 = (uint)bVar2 | uVar10 * 0x100;
      }
      uVar5 = (uVar18 >> 0xb) * (uint)*(ushort *)((long)pUVar15 + lVar9 + 2);
      uVar7 = uVar10 - uVar5;
      if (uVar10 < uVar5) {
        lVar9 = (long)pUVar15 + (ulong)(uVar17 << 3) * 2 + lVar9 + 0x104;
        uVar6 = 8;
        iVar4 = 8;
        uVar7 = uVar10;
      }
      else {
        uVar5 = uVar18 - uVar5;
        lVar9 = (long)pUVar15 + lVar9 + 0x204;
        iVar4 = 0x10;
        uVar6 = 0x100;
      }
    }
    uVar10 = 1;
    do {
      uVar17 = uVar5;
      if (uVar5 < 0x1000000) {
        if (pbVar11 <= pbVar14) {
          return DUMMY_ERROR;
        }
        uVar17 = uVar5 << 8;
        bVar2 = *pbVar14;
        pbVar14 = pbVar14 + 1;
        uVar7 = uVar7 << 8 | (uint)bVar2;
      }
      uVar5 = (uVar17 >> 0xb) * (uint)*(ushort *)(lVar9 + (ulong)uVar10 * 2);
      uVar18 = uVar7 - uVar5;
      if (uVar7 < uVar5) {
        uVar10 = uVar10 * 2;
        uVar18 = uVar7;
      }
      else {
        uVar5 = uVar17 - uVar5;
        uVar10 = uVar10 * 2 + 1;
      }
      uVar7 = uVar18;
    } while (uVar10 < uVar6);
    if (uVar3 < uVar8) {
      uVar10 = (iVar4 - uVar6) + uVar10;
      uVar6 = 3;
      if (uVar10 < 3) {
        uVar6 = uVar10;
      }
      uVar10 = 1;
      do {
        uVar7 = uVar5;
        if (uVar5 < 0x1000000) {
          if (pbVar11 <= pbVar14) {
            return DUMMY_ERROR;
          }
          uVar7 = uVar5 << 8;
          bVar2 = *pbVar14;
          pbVar14 = pbVar14 + 1;
          uVar18 = uVar18 << 8 | (uint)bVar2;
        }
        uVar5 = (uVar7 >> 0xb) *
                (uint)*(ushort *)((long)pUVar15 + (ulong)uVar10 * 2 + (ulong)(uVar6 << 7) + 0x360);
        uVar17 = uVar18 - uVar5;
        if (uVar18 < uVar5) {
          uVar10 = uVar10 * 2;
          uVar17 = uVar18;
        }
        else {
          uVar5 = uVar7 - uVar5;
          uVar10 = uVar10 * 2 + 1;
        }
        uVar18 = uVar17;
      } while (uVar10 < 0x40);
      uVar6 = uVar10 - 0x40;
      if (3 < uVar6) {
        if (uVar6 < 0xe) {
          iVar4 = (uVar6 >> 1) - 1;
          pUVar15 = pUVar15 + (ulong)((uVar10 & 1 | 2) << ((byte)iVar4 & 0x1f)) +
                              (0x2af - (ulong)uVar6);
        }
        else {
          iVar4 = (uVar6 >> 1) - 5;
          do {
            if (uVar5 < 0x1000000) {
              if (pbVar11 <= pbVar14) {
                return DUMMY_ERROR;
              }
              uVar5 = uVar5 << 8;
              bVar2 = *pbVar14;
              pbVar14 = pbVar14 + 1;
              uVar17 = uVar17 << 8 | (uint)bVar2;
            }
            uVar5 = uVar5 >> 1;
            uVar10 = 0;
            if (-1 < (int)(uVar17 - uVar5)) {
              uVar10 = uVar5;
            }
            uVar17 = uVar17 - uVar10;
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
          pUVar15 = pUVar15 + 0x322;
          iVar4 = 4;
        }
        uVar10 = 1;
        do {
          uVar6 = uVar5;
          if (uVar5 < 0x1000000) {
            if (pbVar11 <= pbVar14) {
              return DUMMY_ERROR;
            }
            uVar6 = uVar5 << 8;
            bVar2 = *pbVar14;
            pbVar14 = pbVar14 + 1;
            uVar17 = uVar17 << 8 | (uint)bVar2;
          }
          uVar5 = (uVar6 >> 0xb) * (uint)pUVar15[uVar10];
          uVar7 = uVar17 - uVar5;
          if (uVar17 < uVar5) {
            uVar10 = uVar10 * 2;
            uVar7 = uVar17;
          }
          else {
            uVar5 = uVar6 - uVar5;
            uVar10 = uVar10 * 2 + 1;
          }
          iVar4 = iVar4 + -1;
          uVar17 = uVar7;
        } while (iVar4 != 0);
      }
    }
  }
  EVar1 = DUMMY_ERROR;
  if (pbVar14 < pbVar11) {
    EVar1 = EVar12;
  }
  if (0xffffff < uVar5) {
    EVar1 = EVar12;
  }
  return EVar1;
}

Assistant:

static ELzmaDummy LzmaDec_TryDummy(const CLzmaDec *p, const Byte *buf, SizeT inSize)
{
  UInt32 range = p->range;
  UInt32 code = p->code;
  const Byte *bufLimit = buf + inSize;
  const CLzmaProb *probs = p->probs;
  unsigned state = p->state;
  ELzmaDummy res;

  {
    const CLzmaProb *prob;
    UInt32 bound;
    unsigned ttt;
    unsigned posState = (p->processedPos) & ((1 << p->prop.pb) - 1);

    prob = probs + IsMatch + (state << kNumPosBitsMax) + posState;
    IF_BIT_0_CHECK(prob)
    {
      UPDATE_0_CHECK

      /* if (bufLimit - buf >= 7) return DUMMY_LIT; */

      prob = probs + Literal;
      if (p->checkDicSize != 0 || p->processedPos != 0)
        prob += ((UInt32)LZMA_LIT_SIZE *
            ((((p->processedPos) & ((1 << (p->prop.lp)) - 1)) << p->prop.lc) +
            (p->dic[(p->dicPos == 0 ? p->dicBufSize : p->dicPos) - 1] >> (8 - p->prop.lc))));

      if (state < kNumLitStates)
      {
        unsigned symbol = 1;
        do { GET_BIT_CHECK(prob + symbol, symbol) } while (symbol < 0x100);
      }
      else
      {
        unsigned matchByte = p->dic[p->dicPos - p->reps[0] +
            (p->dicPos < p->reps[0] ? p->dicBufSize : 0)];
        unsigned offs = 0x100;
        unsigned symbol = 1;
        do
        {
          unsigned bit;
          const CLzmaProb *probLit;
          matchByte <<= 1;
          bit = (matchByte & offs);
          probLit = prob + offs + bit + symbol;
          GET_BIT2_CHECK(probLit, symbol, offs &= ~bit, offs &= bit)
        }
        while (symbol < 0x100);
      }
      res = DUMMY_LIT;
    }
    else
    {
      unsigned len;
      UPDATE_1_CHECK;

      prob = probs + IsRep + state;
      IF_BIT_0_CHECK(prob)
      {
        UPDATE_0_CHECK;
        state = 0;
        prob = probs + LenCoder;
        res = DUMMY_MATCH;
      }
      else
      {
        UPDATE_1_CHECK;
        res = DUMMY_REP;
        prob = probs + IsRepG0 + state;
        IF_BIT_0_CHECK(prob)
        {
          UPDATE_0_CHECK;
          prob = probs + IsRep0Long + (state << kNumPosBitsMax) + posState;
          IF_BIT_0_CHECK(prob)
          {
            UPDATE_0_CHECK;
            NORMALIZE_CHECK;
            return DUMMY_REP;
          }
          else
          {
            UPDATE_1_CHECK;
          }
        }
        else
        {
          UPDATE_1_CHECK;
          prob = probs + IsRepG1 + state;
          IF_BIT_0_CHECK(prob)
          {
            UPDATE_0_CHECK;
          }
          else
          {
            UPDATE_1_CHECK;
            prob = probs + IsRepG2 + state;
            IF_BIT_0_CHECK(prob)
            {
              UPDATE_0_CHECK;
            }
            else
            {
              UPDATE_1_CHECK;
            }
          }
        }
        state = kNumStates;
        prob = probs + RepLenCoder;
      }
      {
        unsigned limit, offset;
        const CLzmaProb *probLen = prob + LenChoice;
        IF_BIT_0_CHECK(probLen)
        {
          UPDATE_0_CHECK;
          probLen = prob + LenLow + (posState << kLenNumLowBits);
          offset = 0;
          limit = 1 << kLenNumLowBits;
        }
        else
        {
          UPDATE_1_CHECK;
          probLen = prob + LenChoice2;
          IF_BIT_0_CHECK(probLen)
          {
            UPDATE_0_CHECK;
            probLen = prob + LenMid + (posState << kLenNumMidBits);
            offset = kLenNumLowSymbols;
            limit = 1 << kLenNumMidBits;
          }
          else
          {
            UPDATE_1_CHECK;
            probLen = prob + LenHigh;
            offset = kLenNumLowSymbols + kLenNumMidSymbols;
            limit = 1 << kLenNumHighBits;
          }
        }